

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O0

type * dukglue_pcall_method<DukValue,DukValue>
                 (type *__return_storage_ptr__,duk_context *ctx,DukValue *obj,char *method_name)

{
  duk_int_t return_code;
  DukErrorException *this;
  DukValue *pDStack_90;
  duk_idx_t rc;
  SafeMethodCallData<DukValue,_DukValue> data;
  DukValue out;
  char *method_name_local;
  DukValue *obj_local;
  duk_context *ctx_local;
  
  DukValue::DukValue((DukValue *)&data.out);
  pDStack_90 = obj;
  data.obj = (DukValue *)method_name;
  data._16_8_ = &data.out;
  return_code = duk_safe_call(ctx,dukglue::detail::call_method_safe<DukValue,DukValue>,
                              &stack0xffffffffffffff70,0,1);
  if (return_code != 0) {
    this = (DukErrorException *)__cxa_allocate_exception(0x28);
    DukErrorException::DukErrorException(this,ctx,return_code,true);
    __cxa_throw(this,&DukErrorException::typeinfo,DukErrorException::~DukErrorException);
  }
  duk_pop(ctx);
  DukValue::DukValue(__return_storage_ptr__,(DukValue *)&data.out);
  DukValue::~DukValue((DukValue *)&data.out);
  return __return_storage_ptr__;
}

Assistant:

typename std::enable_if<!std::is_void<RetT>::value, RetT>::type dukglue_pcall_method(duk_context* ctx, const ObjT& obj, const char* method_name, ArgTs... args)
{
	RetT out;
	dukglue::detail::SafeMethodCallData<RetT, ObjT, ArgTs...> data {
		&obj, method_name, std::tuple<ArgTs...>(args...), &out
	};

	duk_idx_t rc = duk_safe_call(ctx, &dukglue::detail::call_method_safe<RetT, ObjT, ArgTs...>, (void*) &data, 0, 1);
	if (rc != 0)
		throw DukErrorException(ctx, rc);

	duk_pop(ctx);  // remove result from stack
	return std::move(out);
}